

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O3

int ftmgr_aeq_handle(ftmgr *ftmgr,uint8_t aeq,uint8_t *offset)

{
  unsigned_long uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int *piVar8;
  unsigned_long uVar9;
  long lVar10;
  unsigned_long uVar11;
  bool bVar12;
  timeval local_38;
  
  uVar5 = CONCAT71(in_register_00000031,aeq);
  uVar6 = uVar5 & 0xffffffff;
  if ((ftmgr->bitmap >> ((uint)uVar5 & 0x1f) & 1) == 0) {
    piVar8 = (int *)ftmgr->ftq[uVar6].blk;
    if (*piVar8 == *(int *)offset) {
      ftmgr->tts = ftmgr->tts + -1;
      ftmgr->bitmap = (byte)(1 << (aeq & 0x1f)) | ftmgr->bitmap;
      lVar10 = (ulong)ftmgr->ftq[uVar6].size - 4;
      gettimeofday(&local_38,(__timezone_ptr_t)0x0);
      uVar9 = (ftmgr->pr).pr_cursize + lVar10;
      uVar11 = local_38.tv_sec * 1000000 + local_38.tv_usec;
      (ftmgr->pr).pr_cursize = uVar9;
      uVar5 = (ftmgr->pr).pr_total;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar5;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar9 * 100;
      if ((ftmgr->pr).pr_start == 0) {
        (ftmgr->pr).pr_start = uVar11;
      }
      uVar1 = (ftmgr->pr).pr_time;
      if (uVar1 != 0) {
        iVar4 = SUB164(auVar3 / auVar2,0);
        iVar7 = iVar4 + 3;
        if (-1 < iVar4) {
          iVar7 = iVar4;
        }
        mgr_print((ftmgr->pr).chmgr,"%s %3d%% [%.*s%.*s] %ld B/s %ld/%ld KB    \r","send",
                  SUB168(auVar3 / auVar2,0),(ulong)(uint)(iVar7 >> 2),"#########################",
                  (ulong)(0x19 - (iVar7 >> 2)),"                         ",
                  (ulong)(lVar10 * 1000000) / (uVar11 - uVar1),uVar9 >> 10,uVar5 >> 10);
        uVar5 = (ftmgr->pr).pr_total;
        uVar9 = (ftmgr->pr).pr_cursize;
      }
      if (uVar9 == uVar5) {
        uVar6 = uVar11 - (ftmgr->pr).pr_start;
        mgr_print((ftmgr->pr).chmgr,"\nTotal: %ld KB, %ld S, %ld B/s\n",uVar5 >> 10,uVar6 / 1000000,
                  (uVar5 * 1000000) / uVar6);
      }
      (ftmgr->pr).pr_time = uVar11;
      ftmgr_fill(ftmgr);
      ftmgr_timedout(ftmgr);
      goto LAB_00102616;
    }
  }
  else {
    piVar8 = (int *)ftmgr->ftq[uVar6].blk;
  }
  if ((*piVar8 != *(int *)offset) && (((byte)loglevel & 1) != 0)) {
    syslog(3,"packted resend seq = %02x\n",uVar5 & 0xffffffff);
  }
LAB_00102616:
  bVar12 = ftmgr->bitmap != 0xff;
  if (!bVar12) {
    fm_write(ftmgr->chmgr,0x82,(void *)0x0,0);
  }
  return (uint)bVar12;
}

Assistant:

int ftmgr_aeq_handle(struct ftmgr *ftmgr, uint8_t aeq, const uint8_t offset[4])
{
    if(!(ftmgr->bitmap & (1 << aeq)) && !memcmp(ftmgr->ftq[aeq].blk, offset, 4)) {
        ftmgr->tts--;
        ftmgr->bitmap |= (1 << aeq);
        progress(&ftmgr->pr, ftmgr->ftq[aeq].size - BLK_HDR_SIZE, "send");
        ftmgr_fill(ftmgr);
        ftmgr_timedout(ftmgr);
    } else if(memcmp(ftmgr->ftq[aeq].blk, offset, 4)) {
        LOGE("packted resend seq = %02x\n", aeq);
    }

    if(ftmgr->bitmap == (__typeof__(ftmgr->bitmap))-1) {
        fm_write(ftmgr->chmgr, CTRL_BLK_COMP, NULL, 0);
        return 0;
    }
    return 1;
}